

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O3

void __thiscall temp_box::temp_box(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  undefined1 *puVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  fvector3 edge [3];
  float afStack_a8 [8];
  float local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  this->state = 0;
  pcVar5 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = 3;
  pfVar10 = local_88;
  do {
    lVar14 = lVar8;
    if (lVar8 == 3) {
      lVar14 = 0;
    }
    uVar3 = *(uint *)((long)&face->field_0 + lVar14 * 4);
    uVar4 = *(uint *)((long)face + lVar8 * 4 + -4);
    uVar1 = *(undefined8 *)&pcVar5[uVar3].p.field_0;
    uVar2 = *(undefined8 *)&pcVar5[uVar4].p.field_0;
    *(ulong *)(pfVar10 + -2) =
         CONCAT44((float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20),
                  (float)uVar1 - (float)uVar2);
    *pfVar10 = pcVar5[uVar3].p.field_0.field_0.z - pcVar5[uVar4].p.field_0.field_0.z;
    pfVar10 = pfVar10 + -3;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  puVar12 = (undefined1 *)((long)&face->field_0 + 0x10);
  uVar13 = 3;
  uVar11 = 4;
  lVar8 = 0x24;
  lVar15 = 0x2c;
  lVar14 = 6;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar13;
    if (lVar14 == -3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                    ,0x2f,"temp_box::temp_box(const cf_face &, const cf_vertex_vec &)");
    }
    uVar9 = SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
    uVar1 = *(undefined8 *)(afStack_a8 + lVar14);
    fVar21 = (float)uVar1;
    fVar22 = (float)((ulong)uVar1 >> 0x20);
    uVar2 = *(undefined8 *)((long)afStack_a8 + lVar8 + uVar9 * -9);
    fVar17 = (float)uVar2;
    fVar18 = (float)((ulong)uVar2 >> 0x20);
    fVar20 = afStack_a8[lVar14 + 2];
    fVar19 = *(float *)((long)afStack_a8 + lVar15 + uVar9 * -9);
    fVar16 = (fVar19 * fVar19 + fVar17 * fVar17 + fVar18 * fVar18) *
             (fVar20 * fVar20 + fVar21 * fVar21 + fVar22 * fVar22);
    if (fVar16 < 0.0) {
      uStack_40 = 0;
      local_58 = ZEXT416((uint)fVar19);
      local_68 = ZEXT416((uint)fVar20);
      uStack_70 = 0;
      local_78 = uVar1;
      local_48 = uVar2;
      fVar16 = sqrtf(fVar16);
      fVar17 = (float)local_48;
      fVar18 = local_48._4_4_;
      fVar19 = (float)local_58._0_4_;
      fVar20 = (float)local_68._0_4_;
      fVar21 = (float)local_78;
      fVar22 = local_78._4_4_;
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    uVar13 = uVar13 - 1;
    fVar16 = (fVar20 * fVar19 + fVar21 * fVar17 + fVar22 * fVar18) / fVar16;
    puVar12 = puVar12 + -4;
    uVar11 = uVar11 - 1;
    lVar8 = lVar8 + -0xc;
    lVar15 = lVar15 + -0xc;
    lVar14 = lVar14 + -3;
  } while (0.001 <= (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar16 |
                           (uint)(0.0 - fVar16) & -(uint)(fVar16 < 0.0)));
  *(ulong *)&(this->xform).field_0 = CONCAT44(fVar22,fVar21) ^ 0x8000000080000000;
  (this->xform).field_0.field_0._13 = -fVar20;
  *(ulong *)((long)&(this->xform).field_0 + 0x10) = CONCAT44(fVar18,fVar17);
  (this->xform).field_0.field_0._23 = fVar19;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar11;
  uVar3 = *(uint *)(puVar12 +
                   (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) * -3);
  this->base_idx = uVar3;
  pcVar5 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (this->xform).field_0.field_0._41 = pcVar5[uVar3].p.field_0.field_0.x;
  (this->xform).field_0.field_0._42 = pcVar5[uVar3].p.field_0.field_0.y;
  (this->xform).field_0.field_0._43 = pcVar5[uVar3].p.field_0.field_0.z;
  this->inner = *(uint16_t *)((long)&face->field_1 + 2);
  this->outer = *(ushort *)&face->field_1 & 0x3fff;
  return;
}

Assistant:

temp_box::temp_box(const cf_face& face, const cf_vertex_vec& verts): state(STATE_COLLECTING)
{
	fvector3 edge[3];
	for (uint_fast32_t i = 3; i != 0;) {
		--i;
		edge[i].sub(verts[face.v[(i+1)%3]].p, verts[face.v[i]].p);
	}
	for (uint_fast32_t i = 3; i != 0;) {
		uint_fast32_t j = i%3;
		if (equivalent(edge[--i].cosine(edge[j]), 0.f, k_zero_tolerance)) {
			xform.i.invert(edge[i]);
			xform.j.set(edge[j]);
			xform.c.set(verts[base_idx = face.v[j]].p);
			inner = face.sector;
			outer = face.material;
			return;
		}
	}
	xr_not_expected();
}